

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_unsignedByte(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  undefined1 *__src;
  void *pvVar10;
  bool bVar11;
  StrX local_788;
  StrX local_778;
  char *local_768;
  char *actRetCanRep_inchar_5;
  wchar16 *local_750;
  XMLCh *actRetCanRep_9;
  undefined1 local_740 [4];
  Status myStatus_23;
  StrX local_730;
  char *local_720;
  char *actRetCanRep_inchar_4;
  wchar16 *local_708;
  XMLCh *actRetCanRep_8;
  undefined1 local_6f8 [4];
  Status myStatus_22;
  StrX local_6e8;
  StrX local_6d8;
  long local_6c8;
  XMLCh *actRetCanRep_7;
  undefined1 local_6b8 [4];
  Status myStatus_21;
  StrX local_6a8;
  StrX local_698;
  long local_688;
  XMLCh *actRetCanRep_6;
  undefined1 local_678 [4];
  Status myStatus_20;
  StrX local_668;
  StrX local_658;
  long local_648;
  XMLCh *actRetCanRep_5;
  undefined1 local_638 [4];
  Status myStatus_19;
  StrX local_628;
  StrX local_618;
  long local_608;
  XMLCh *actRetCanRep_4;
  undefined1 local_5f8 [4];
  Status myStatus_18;
  StrX local_5e8;
  char *local_5d8;
  char *actRetCanRep_inchar_3;
  wchar16 *local_5c0;
  XMLCh *actRetCanRep_3;
  undefined1 local_5b0 [4];
  Status myStatus_17;
  StrX local_5a0;
  char *local_590;
  char *actRetCanRep_inchar_2;
  wchar16 *local_578;
  XMLCh *actRetCanRep_2;
  undefined1 local_568 [4];
  Status myStatus_16;
  StrX local_558;
  char *local_548;
  char *actRetCanRep_inchar_1;
  wchar16 *local_530;
  XMLCh *actRetCanRep_1;
  undefined1 local_520 [4];
  Status myStatus_15;
  StrX local_510;
  char *local_500;
  char *actRetCanRep_inchar;
  wchar16 *local_4e8;
  XMLCh *actRetCanRep;
  Status myStatus_14;
  int j;
  StrX local_4c8;
  StrX local_4b8;
  XSValue *local_4a8;
  XSValue *actRetValue_6;
  undefined1 local_498 [4];
  Status myStatus_13;
  StrX local_488;
  StrX local_478;
  XSValue *local_468;
  XSValue *actRetValue_5;
  undefined1 local_458 [4];
  Status myStatus_12;
  StrX local_448;
  StrX local_438;
  XSValue *local_428;
  XSValue *actRetValue_4;
  undefined1 local_418 [4];
  Status myStatus_11;
  StrX local_408;
  StrX local_3f8;
  XSValue *local_3e8;
  XSValue *actRetValue_3;
  undefined1 local_3d8 [4];
  Status myStatus_10;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  StrX local_378;
  XSValue *local_368;
  XSValue *actRetValue_2;
  undefined1 local_358 [4];
  Status myStatus_9;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  StrX local_2f8;
  XSValue *local_2e8;
  XSValue *actRetValue_1;
  undefined1 local_2d8 [4];
  Status myStatus_8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  StrX local_278;
  XSValue *local_268;
  XSValue *actRetValue;
  Status myStatus_7;
  int i;
  StrX local_248;
  StrX local_238;
  byte local_225;
  Status local_224;
  undefined1 local_220 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_210;
  StrX local_200;
  byte local_1ed;
  Status local_1ec;
  undefined1 local_1e8 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_1d8;
  StrX local_1c8;
  byte local_1b5;
  Status local_1b4;
  undefined1 local_1b0 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_1a0;
  StrX local_190;
  byte local_17d;
  Status local_17c;
  undefined1 local_178 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_168;
  byte local_155;
  Status local_154;
  undefined1 local_150 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_140;
  byte local_12d;
  Status local_12c;
  undefined1 local_128 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_108;
  byte local_f5;
  Status local_f4;
  char acStack_f0 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_2 [4];
  char data_rawstr_2 [7];
  char data_canrep_1 [4];
  char data_rawstr_1 [11];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char local_b4 [4];
  char lex_v_ran_iv_2_canrep [3];
  char lex_v_ran_iv_1_canrep [4];
  undefined1 local_a8 [2];
  char lex_v_ran_v_2_canrep [2];
  char lex_v_ran_v_1_canrep [4];
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  XSValue_Data act_v_ran_v_0;
  char local_28 [4];
  char lex_v_ran_iv_2 [3];
  char lex_v_ran_iv_1 [5];
  char lex_v_ran_v_2 [2];
  char lex_v_ran_v_1 [5];
  char lex_v_ran_v_0 [11];
  bool toValidate;
  DataType dt;
  
  _lex_v_ran_v_1 = 0x20333231202020;
  builtin_strncpy(lex_v_ran_iv_1,"+255",5);
  stack0xffffffffffffffde = 0x30;
  lex_v_ran_iv_2[0] = '\0';
  builtin_strncpy(local_28,"+256",4);
  act_v_ran_v_0.fValue._30_1_ = 0;
  act_v_ran_v_0.fValue._28_2_ = 0x312d;
  act_v_ran_v_0.f_datatype._0_1_ = 0x7b;
  act_v_ran_v_1.f_datatype._0_1_ = 0xff;
  act_v_ran_v_2.f_datatype._0_1_ = dt_string;
  builtin_strncpy(lex_v_ran_iv_1_canrep,"255",4);
  stack0xffffffffffffff52 = 0x30;
  builtin_strncpy(local_b4,"256",4);
  lex_iv_1[8] = '-';
  lex_iv_1[9] = '1';
  builtin_strncpy(lex_iv_2,"12b34.45",8);
  lex_iv_1[0] = '6';
  lex_iv_1[1] = '\0';
  stack0xffffffffffffff30 = 0x36356234333231;
  stack0xffffffffffffff20 = 0x3332312b202020;
  data_rawstr_2[0] = '1';
  data_rawstr_2[1] = '2';
  data_rawstr_2[2] = '3';
  data_rawstr_2[3] = '\0';
  data_canrep_2[0] = '2';
  data_canrep_2[1] = '3';
  data_canrep_2[2] = '\0';
  myStatus = 0x31303030;
  _acStack_f0 = 0x333231;
  local_f4 = st_Init;
  StrX::StrX(&local_108,lex_v_ran_v_1);
  pXVar3 = StrX::unicodeForm(&local_108);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedByte,&local_f4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_108);
  local_f5 = bVar1 & 1;
  if (local_f5 != 1) {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX((StrX *)local_128,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_128);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb9f,lex_v_ran_v_1,pcVar4,1);
    StrX::~StrX((StrX *)local_128);
    errSeen = true;
  }
  local_12c = st_Init;
  StrX::StrX(&local_140,lex_v_ran_iv_1);
  pXVar3 = StrX::unicodeForm(&local_140);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedByte,&local_12c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_140);
  local_12d = bVar1 & 1;
  if (local_12d != 1) {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX((StrX *)local_150,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_150);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba0,lex_v_ran_iv_1,pcVar4,1);
    StrX::~StrX((StrX *)local_150);
    errSeen = true;
  }
  local_154 = st_Init;
  StrX::StrX(&local_168,lex_v_ran_iv_2 + 2);
  pXVar3 = StrX::unicodeForm(&local_168);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedByte,&local_154,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_168);
  local_155 = bVar1 & 1;
  if (local_155 != 1) {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX((StrX *)local_178,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_178);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba1,lex_v_ran_iv_2 + 2,pcVar4,1);
    StrX::~StrX((StrX *)local_178);
    errSeen = true;
  }
  local_17c = st_Init;
  StrX::StrX(&local_190,local_28);
  pXVar3 = StrX::unicodeForm(&local_190);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedByte,&local_17c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_190);
  local_17d = bVar1 & 1;
  if (local_17d == 0) {
    if (local_17c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_1b0,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_1b0);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_17c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba4,local_28,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_1b0);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX(&local_1a0,pXVar3);
    pcVar4 = StrX::localForm(&local_1a0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba4,local_28,pcVar4,0);
    StrX::~StrX(&local_1a0);
    errSeen = true;
  }
  local_1b4 = st_Init;
  StrX::StrX(&local_1c8,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
  pXVar3 = StrX::unicodeForm(&local_1c8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedByte,&local_1b4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1c8);
  local_1b5 = bVar1 & 1;
  if (local_1b5 == 0) {
    if (local_1b4 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_1e8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_1e8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1b4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba5,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_1e8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX(&local_1d8,pXVar3);
    pcVar4 = StrX::localForm(&local_1d8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba5,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,0);
    StrX::~StrX(&local_1d8);
    errSeen = true;
  }
  local_1ec = st_Init;
  StrX::StrX(&local_200,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_200);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedByte,&local_1ec,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_200);
  local_1ed = bVar1 & 1;
  if (local_1ed == 0) {
    if (local_1ec != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_220,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_220);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1ec);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba8,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_220);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX(&local_210,pXVar3);
    pcVar4 = StrX::localForm(&local_210);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba8,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_210);
    errSeen = true;
  }
  local_224 = st_Init;
  StrX::StrX(&local_238,data_rawstr_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_238);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_unsignedByte,&local_224,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_238);
  local_225 = bVar1 & 1;
  if (local_225 == 0) {
    if (local_224 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)&myStatus_7,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_7);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_224);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba9,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_7);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX(&local_248,pXVar3);
    pcVar4 = StrX::localForm(&local_248);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba9,data_rawstr_1 + 8,pcVar4,0);
    StrX::~StrX(&local_248);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_278,lex_v_ran_v_1);
    pXVar3 = StrX::unicodeForm(&local_278);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedByte,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_278);
    local_268 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_2d8,pXVar3);
      StrX::localForm((StrX *)local_2d8);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc6,lex_v_ran_v_1);
      StrX::~StrX((StrX *)local_2d8);
      errSeen = true;
    }
    else {
      memcpy(&local_2a0,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_1.fValue + 0x18);
      memcpy(&local_2c8,pvVar10,0x28);
      actValue.fValue.f_long = uStack_298;
      actValue._0_8_ = local_2a0;
      actValue.fValue._8_8_ = local_290;
      actValue.fValue._16_8_ = uStack_288;
      actValue.fValue.f_datetime.f_milisec = (double)local_280;
      expValue.fValue.f_long = uStack_2c0;
      expValue._0_8_ = local_2c8;
      expValue.fValue._8_8_ = local_2b8;
      expValue.fValue._16_8_ = uStack_2b0;
      expValue.fValue.f_datetime.f_milisec = (double)local_2a8;
      bVar2 = compareActualValue(dt_unsignedByte,actValue,expValue);
      pXVar5 = local_268;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_268 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_268);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_2f8,lex_v_ran_iv_1);
    pXVar3 = StrX::unicodeForm(&local_2f8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedByte,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2f8);
    local_2e8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_358,pXVar3);
      StrX::localForm((StrX *)local_358);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc8,lex_v_ran_iv_1);
      StrX::~StrX((StrX *)local_358);
      errSeen = true;
    }
    else {
      memcpy(&local_320,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_348,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_318;
      actValue_00._0_8_ = local_320;
      actValue_00.fValue._8_8_ = local_310;
      actValue_00.fValue._16_8_ = uStack_308;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_300;
      expValue_00.fValue.f_long = uStack_340;
      expValue_00._0_8_ = local_348;
      expValue_00.fValue._8_8_ = local_338;
      expValue_00.fValue._16_8_ = uStack_330;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_328;
      bVar2 = compareActualValue(dt_unsignedByte,actValue_00,expValue_00);
      pXVar5 = local_2e8;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_2e8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2e8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_378,lex_v_ran_iv_2 + 2);
    pXVar3 = StrX::unicodeForm(&local_378);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedByte,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_378);
    local_368 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_3d8,pXVar3);
      StrX::localForm((StrX *)local_3d8);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc9,lex_v_ran_iv_2 + 2);
      StrX::~StrX((StrX *)local_3d8);
      errSeen = true;
    }
    else {
      memcpy(&local_3a0,pXVar5,0x28);
      __src = local_a8;
      memcpy(&local_3c8,__src,0x28);
      actValue_01.fValue.f_long = uStack_398;
      actValue_01._0_8_ = local_3a0;
      actValue_01.fValue._8_8_ = local_390;
      actValue_01.fValue._16_8_ = uStack_388;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_380;
      expValue_01.fValue.f_long = uStack_3c0;
      expValue_01._0_8_ = local_3c8;
      expValue_01.fValue._8_8_ = local_3b8;
      expValue_01.fValue._16_8_ = uStack_3b0;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_3a8;
      bVar2 = compareActualValue(dt_unsignedByte,actValue_01,expValue_01);
      pXVar5 = local_368;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_368 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_368);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,__src);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_3f8,local_28);
    pXVar3 = StrX::unicodeForm(&local_3f8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedByte,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3f8);
    local_3e8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX((StrX *)local_418,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_418);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbca,local_28,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_418);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX(&local_408,pXVar3);
      StrX::localForm(&local_408);
      pvVar10 = (void *)0xbca;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbca,local_28);
      StrX::~StrX(&local_408);
      pXVar5 = local_3e8;
      errSeen = true;
      if (local_3e8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3e8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_438,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
    pXVar3 = StrX::unicodeForm(&local_438);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedByte,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_438);
    local_428 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX((StrX *)local_458,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_458);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbcb,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_458);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX(&local_448,pXVar3);
      StrX::localForm(&local_448);
      pvVar10 = (void *)0xbcb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbcb,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c));
      StrX::~StrX(&local_448);
      pXVar5 = local_428;
      errSeen = true;
      if (local_428 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_428);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_478,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_478);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedByte,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    local_468 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX((StrX *)local_498,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_498);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbcd,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_498);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX(&local_488,pXVar3);
      StrX::localForm(&local_488);
      pvVar10 = (void *)0xbcd;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbcd,lex_iv_2);
      StrX::~StrX(&local_488);
      pXVar5 = local_468;
      errSeen = true;
      if (local_468 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_468);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = st_Init;
    StrX::StrX(&local_4b8,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_4b8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_unsignedByte,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4b8);
    local_4a8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX((StrX *)&myStatus_14,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_14);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_6._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbce,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_14);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX(&local_4c8,pXVar3);
      StrX::localForm(&local_4c8);
      pvVar10 = (void *)0xbce;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbce,data_rawstr_1 + 8);
      StrX::~StrX(&local_4c8);
      pXVar5 = local_4a8;
      errSeen = true;
      if (local_4a8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4a8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_rawstr_2 + 4);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedByte,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_4e8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_520,pXVar3);
      StrX::localForm((StrX *)local_520);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbec,data_rawstr_2 + 4);
      StrX::~StrX((StrX *)local_520);
      errSeen = true;
    }
    else {
      local_500 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_500,data_rawstr_2);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX(&local_510,pXVar3);
        pcVar4 = StrX::localForm(&local_510);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbec,data_rawstr_2 + 4,pcVar4,local_500,data_rawstr_2);
        StrX::~StrX(&local_510);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4e8);
      xercesc_4_0::XMLString::release(&local_500,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,(char *)&myStatus);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedByte,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_530 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_568,pXVar3);
      StrX::localForm((StrX *)local_568);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbed,&myStatus);
      StrX::~StrX((StrX *)local_568);
      errSeen = true;
    }
    else {
      local_548 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_548,acStack_f0);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX(&local_558,pXVar3);
        pcVar4 = StrX::localForm(&local_558);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbed,&myStatus,pcVar4,local_548,acStack_f0);
        StrX::~StrX(&local_558);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_530);
      xercesc_4_0::XMLString::release(&local_548,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,lex_v_ran_iv_1);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedByte,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_578 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_5b0,pXVar3);
      StrX::localForm((StrX *)local_5b0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbef,lex_v_ran_iv_1);
      StrX::~StrX((StrX *)local_5b0);
      errSeen = true;
    }
    else {
      local_590 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_590,lex_v_ran_iv_1_canrep);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX(&local_5a0,pXVar3);
        pcVar4 = StrX::localForm(&local_5a0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbef,lex_v_ran_iv_1,pcVar4,local_590,lex_v_ran_iv_1_canrep);
        StrX::~StrX(&local_5a0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_578);
      xercesc_4_0::XMLString::release(&local_590,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,lex_v_ran_iv_2 + 2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_unsignedByte,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_5c0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_5f8,pXVar3);
      StrX::localForm((StrX *)local_5f8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf0,lex_v_ran_iv_2 + 2);
      StrX::~StrX((StrX *)local_5f8);
      errSeen = true;
    }
    else {
      local_5d8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_5d8,lex_v_ran_iv_2_canrep + 2);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX(&local_5e8,pXVar3);
        pcVar4 = StrX::localForm(&local_5e8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbf0,lex_v_ran_iv_2 + 2,pcVar4,local_5d8,lex_v_ran_iv_2_canrep + 2);
        StrX::~StrX(&local_5e8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5c0);
      xercesc_4_0::XMLString::release(&local_5d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_618,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_618);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_unsignedByte,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_618);
    local_608 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX((StrX *)local_638,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_638);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xbf2,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_638);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX(&local_628,pXVar3);
      StrX::localForm(&local_628);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf2,lex_iv_2);
      StrX::~StrX(&local_628);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_608);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_658,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_658);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_unsignedByte,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_658);
    local_648 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_unsignedByte);
        StrX::StrX((StrX *)local_678,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_678);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xbf3,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_678);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX(&local_668,pXVar3);
      StrX::localForm(&local_668);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf3,data_rawstr_1 + 8);
      StrX::~StrX(&local_668);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_648);
      errSeen = true;
    }
  }
  actRetCanRep_6._4_4_ = st_Init;
  StrX::StrX(&local_698,local_28);
  pXVar3 = StrX::unicodeForm(&local_698);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_unsignedByte,(Status *)((long)&actRetCanRep_6 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_698);
  local_688 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_6._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_6b8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_6b8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_6._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xbf8,local_28,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_6b8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX(&local_6a8,pXVar3);
    StrX::localForm(&local_6a8);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbf8,local_28);
    StrX::~StrX(&local_6a8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_688);
    errSeen = true;
  }
  actRetCanRep_7._4_4_ = st_Init;
  StrX::StrX(&local_6d8,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
  pXVar3 = StrX::unicodeForm(&local_6d8);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_unsignedByte,(Status *)((long)&actRetCanRep_7 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_6d8);
  local_6c8 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_7._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX((StrX *)local_6f8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_6f8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_7._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xbf9,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_6f8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX(&local_6e8,pXVar3);
    pcVar4 = StrX::localForm(&local_6e8);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbf9,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4);
    StrX::~StrX(&local_6e8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6c8);
    errSeen = true;
  }
  actRetCanRep_8._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_4,local_28);
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_unsignedByte,(Status *)((long)&actRetCanRep_8 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
  local_708 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX((StrX *)local_740,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_740);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbfc,local_28,pcVar4);
    StrX::~StrX((StrX *)local_740);
    errSeen = true;
  }
  else {
    local_720 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_720,local_b4);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX(&local_730,pXVar3);
      pcVar4 = StrX::localForm(&local_730);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xbfc,local_28,pcVar4,local_720,local_b4);
      StrX::~StrX(&local_730);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_708);
    xercesc_4_0::XMLString::release(&local_720,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  actRetCanRep_9._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_5,(char *)((long)&act_v_ran_v_0.fValue + 0x1c));
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_unsignedByte,(Status *)((long)&actRetCanRep_9 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
  local_750 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_unsignedByte);
    StrX::StrX(&local_788,pXVar3);
    pcVar4 = StrX::localForm(&local_788);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbfd,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4);
    StrX::~StrX(&local_788);
    errSeen = true;
  }
  else {
    local_768 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_768,lex_iv_1 + 8);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_unsignedByte);
      StrX::StrX(&local_778,pXVar3);
      pcVar4 = StrX::localForm(&local_778);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xbfd,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x1c),pcVar4,local_768,lex_iv_1 + 8
            );
      StrX::~StrX(&local_778);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_750);
    xercesc_4_0::XMLString::release(&local_768,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
}

Assistant:

void test_dt_unsignedByte()
{
    const XSValue::DataType dt = XSValue::dt_unsignedByte;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   123   \n";

    const char lex_v_ran_v_1[]="+255";
    const char lex_v_ran_v_2[]="0";
    const char lex_v_ran_iv_1[]="+256";
    const char lex_v_ran_iv_2[]="-1";

    XSValue::XSValue_Data act_v_ran_v_0;  act_v_ran_v_0.fValue.f_uchar = (unsigned char)123;
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_uchar = (unsigned char)+255;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_uchar = (unsigned char)0;

    const char lex_v_ran_v_1_canrep[]="255";
    const char lex_v_ran_v_2_canrep[]="0";
    const char lex_v_ran_iv_1_canrep[]="256";
    const char lex_v_ran_iv_2_canrep[]="-1";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.24.2 Canonical representation
 *
 * The canonical representation for unsignedByte is defined by prohibiting certain options from the
 * Lexical representation (3.3.24.1). Specifically,
 * 1. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +123  \n";
    const char data_canrep_1[]="123";
    const char data_rawstr_2[]="000123";
    const char data_canrep_2[]="123";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep,  DONT_CARE);

        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}